

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::CopyImage::IncompleteTexTest::iterate(IncompleteTexTest *this)

{
  ostringstream *this_00;
  GLenum GVar1;
  pointer ptVar2;
  Context *pCVar3;
  int iVar4;
  GLuint GVar5;
  GLenum GVar6;
  IterateResult IVar7;
  undefined4 extraout_var;
  uint uVar8;
  ulong uVar9;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uVar8 = this->m_test_case_index;
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (this->super_TestCase).m_context;
  GVar1 = ptVar2[uVar8].m_tex_target;
  GVar5 = Utils::generateTexture(pCVar3,GVar1);
  Utils::prepareTexture
            (pCVar3,GVar5,GVar1,0x8058,0x1908,0x1401,0,0x10,0x10,6,(GLvoid *)0x0,
             &this->m_dst_buf_name);
  ptVar2 = ptVar2 + uVar8;
  this->m_dst_tex_name = GVar5;
  pCVar3 = (this->super_TestCase).m_context;
  GVar1 = ptVar2->m_tex_target;
  GVar5 = Utils::generateTexture(pCVar3,GVar1);
  Utils::prepareTexture
            (pCVar3,GVar5,GVar1,0x8058,0x1908,0x1401,0,0x10,0x10,6,(GLvoid *)0x0,
             &this->m_src_buf_name);
  this->m_src_tex_name = GVar5;
  if (ptVar2->m_is_dst_complete == true) {
    Utils::makeTextureComplete
              ((this->super_TestCase).m_context,ptVar2->m_tex_target,this->m_dst_tex_name,0,0);
    GVar5 = this->m_src_tex_name;
  }
  if (ptVar2->m_is_src_complete == true) {
    Utils::makeTextureComplete((this->super_TestCase).m_context,ptVar2->m_tex_target,GVar5,0,0);
    GVar5 = this->m_src_tex_name;
  }
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x310))
            (GVar5,ptVar2->m_tex_target,0,0,0,0,this->m_dst_tex_name,ptVar2->m_tex_target,0,0,0,0,1,
             1,1);
  GVar6 = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  GVar1 = ptVar2->m_expected_result;
  clean(this);
  if (GVar1 == GVar6) {
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    uVar8 = this->m_test_case_index + 1;
    this->m_test_case_index = uVar8;
    uVar9 = ((long)(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    IVar7 = (IterateResult)(uVar8 <= uVar9 && uVar9 - uVar8 != 0);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Failure. Expected result: ",0x1a);
    local_1c0.m_value = ptVar2->m_expected_result;
    local_1c0.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," got: ",6);
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = GVar6;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Texture target: ",0x12)
    ;
    local_1e0.m_value = ptVar2->m_tex_target;
    local_1e0.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,". Is source complete: ",0x16);
    std::ostream::_M_insert<bool>(SUB81(this_00,0));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,", is destination complete: ",0x1b);
    std::ostream::_M_insert<bool>(SUB81(this_00,0));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    IVar7 = STOP;
  }
  return IVar7;
}

Assistant:

tcu::TestNode::IterateResult IncompleteTexTest::iterate()
{
	GLenum						 error	 = GL_NO_ERROR;
	const Functions&			 gl		   = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result = tcu::TestNode::STOP;
	bool						 result	= false;
	const testCase&				 test_case = m_test_cases[m_test_case_index];

	try
	{
		/* Prepare textures */
		m_dst_tex_name = Utils::prepareTex16x16x6(m_context, test_case.m_tex_target, GL_RGBA8, GL_RGBA,
												  GL_UNSIGNED_BYTE, m_dst_buf_name);
		m_src_tex_name = Utils::prepareTex16x16x6(m_context, test_case.m_tex_target, GL_RGBA8, GL_RGBA,
												  GL_UNSIGNED_BYTE, m_src_buf_name);

		/* Make textures complete */
		if (true == test_case.m_is_dst_complete)
		{
			Utils::makeTextureComplete(m_context, test_case.m_tex_target, m_dst_tex_name, 0 /* base */, 0 /* max */);
		}

		if (true == test_case.m_is_src_complete)
		{
			Utils::makeTextureComplete(m_context, test_case.m_tex_target, m_src_tex_name, 0 /* base */, 0 /* max */);
		}
	}
	catch (tcu::Exception& exc)
	{
		clean();
		throw exc;
	}

	/* Execute CopyImageSubData */
	gl.copyImageSubData(m_src_tex_name, test_case.m_tex_target, 0 /* srcLevel */, 0 /* srcX */, 0 /* srcY */,
						0 /* srcZ */, m_dst_tex_name, test_case.m_tex_target, 0 /* dstLevel */, 0 /* dstX */,
						0 /* dstY */, 0 /* dstZ */, 1 /* srcWidth */, 1 /* srcHeight */, 1 /* srcDepth */);

	/* Verify generated error */
	error  = gl.getError();
	result = (test_case.m_expected_result == error);

	/* Remove resources */
	clean();

	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Failure. Expected result: " << glu::getErrorStr(test_case.m_expected_result)
			<< " got: " << glu::getErrorStr(error)
			<< ". Texture target: " << glu::getTextureTargetStr(test_case.m_tex_target)
			<< ". Is source complete: " << test_case.m_is_src_complete
			<< ", is destination complete: " << test_case.m_is_dst_complete << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}